

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O0

void alloc_funny_pointers(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_d_main_controller *pjVar2;
  int iVar3;
  _func_void_j_decompress_ptr_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION *p_Var4;
  void *pvVar5;
  JSAMPARRAY xbuf;
  jpeg_component_info *compptr;
  int M;
  int rgroup;
  int ci;
  my_main_ptr main;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->main;
  iVar1 = cinfo->min_DCT_v_scaled_size;
  p_Var4 = (_func_void_j_decompress_ptr_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION *)
           (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)(cinfo->num_components << 1) << 3)
  ;
  pjVar2[6].process_data = p_Var4;
  pjVar2[7].start_pass =
       (_func_void_j_decompress_ptr_J_BUF_MODE *)
       (pjVar2[6].process_data + (long)cinfo->num_components * 8);
  M = 0;
  xbuf = (JSAMPARRAY)cinfo->comp_info;
  for (; M < cinfo->num_components; M = M + 1) {
    iVar3 = (*(int *)((long)xbuf + 0xc) * *(int *)(xbuf + 5)) / cinfo->min_DCT_v_scaled_size;
    pvVar5 = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)(iVar3 * (iVar1 + 4) * 2) << 3);
    pvVar5 = (void *)((long)pvVar5 + (long)iVar3 * 8);
    *(void **)(pjVar2[6].process_data + (long)M * 8) = pvVar5;
    *(void **)(pjVar2[7].start_pass + (long)M * 8) =
         (void *)((long)pvVar5 + (long)(iVar3 * (iVar1 + 4)) * 8);
    xbuf = xbuf + 0xc;
  }
  return;
}

Assistant:

LOCAL(void)
alloc_funny_pointers (j_decompress_ptr cinfo)
/* Allocate space for the funny pointer lists.
 * This is done only once, not once per pass.
 */
{
  my_main_ptr main = (my_main_ptr) cinfo->main;
  int ci, rgroup;
  int M = cinfo->min_DCT_v_scaled_size;
  jpeg_component_info *compptr;
  JSAMPARRAY xbuf;

  /* Get top-level space for component array pointers.
   * We alloc both arrays with one call to save a few cycles.
   */
  main->xbuffer[0] = (JSAMPIMAGE)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				cinfo->num_components * 2 * SIZEOF(JSAMPARRAY));
  main->xbuffer[1] = main->xbuffer[0] + cinfo->num_components;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    rgroup = (compptr->v_samp_factor * compptr->DCT_v_scaled_size) /
      cinfo->min_DCT_v_scaled_size; /* height of a row group of component */
    /* Get space for pointer lists --- M+4 row groups in each list.
     * We alloc both pointer lists with one call to save a few cycles.
     */
    xbuf = (JSAMPARRAY)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  2 * (rgroup * (M + 4)) * SIZEOF(JSAMPROW));
    xbuf += rgroup;		/* want one row group at negative offsets */
    main->xbuffer[0][ci] = xbuf;
    xbuf += rgroup * (M + 4);
    main->xbuffer[1][ci] = xbuf;
  }
}